

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSMC.h
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>::
CalculateForce(ChVector<double> *__return_storage_ptr__,
              ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>
              *this,double delta,ChVector<double> *normal_dir,ChVector<double> *vel1,
              ChVector<double> *vel2,ChMaterialCompositeSMC *mat)

{
  double dVar1;
  ChSystem *pCVar2;
  long *plVar3;
  double dVar4;
  double dVar5;
  
  if (delta <= 0.0) {
    __return_storage_ptr__->m_data[0] = 0.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    __return_storage_ptr__->m_data[2] = 0.0;
  }
  else {
    pCVar2 = (((this->
               super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>
               ).container)->super_ChPhysicsItem).system;
    plVar3 = *(long **)&pCVar2[1].assembly.super_ChPhysicsItem.super_ChObj.m_name.field_2;
    dVar1 = (this->
            super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>
            ).eff_radius;
    dVar4 = delta;
    (*(((this->
        super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>)
       .objA)->super_ChContactable)._vptr_ChContactable[0xe])();
    dVar5 = dVar4;
    (*(((this->
        super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>)
       .objB)->super_ChContactable)._vptr_ChContactable[0xe])();
    (**(code **)(*plVar3 + 0x10))
              (delta,dVar1,dVar4,dVar5,__return_storage_ptr__,plVar3,pCVar2,normal_dir,
               &(this->
                super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>
                ).p1,&(this->
                      super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>
                      ).p2,vel1,vel2,mat);
  }
  return __return_storage_ptr__;
}

Assistant:

ChVector<> CalculateForce(
        double delta,                      ///< overlap in normal direction
        const ChVector<>& normal_dir,      ///< normal contact direction (expressed in global frame)
        const ChVector<>& vel1,            ///< velocity of contact point on objA (expressed in global frame)
        const ChVector<>& vel2,            ///< velocity of contact point on objB (expressed in global frame)
        const ChMaterialCompositeSMC& mat  ///< composite material for contact pair
    ) {
        // Set contact force to zero if no penetration.
        if (delta <= 0) {
            return ChVector<>(0, 0, 0);
        }

        // Use current SMC algorithm to calculate the force
        ChSystemSMC* sys = static_cast<ChSystemSMC*>(this->container->GetSystem());
        return sys->GetContactForceAlgorithm().CalculateForce(*sys,                                        //
                                                              normal_dir, this->p1, this->p2, vel1, vel2,  //
                                                              mat,                                         //
                                                              delta, this->eff_radius,                     //
                                                              this->objA->GetContactableMass(),            //
                                                              this->objB->GetContactableMass()             //
        );

        /*
        // Extract parameters from containing system
        ChSystemSMC* sys = static_cast<ChSystemSMC*>(this->container->GetSystem());
        double dT = sys->GetStep();
        bool use_mat_props = sys->UsingMaterialProperties();
        ChSystemSMC::ContactForceModel contact_model = sys->GetContactForceModel();
        ChSystemSMC::AdhesionForceModel adhesion_model = sys->GetAdhesionForceModel();
        ChSystemSMC::TangentialDisplacementModel tdispl_model = sys->GetTangentialDisplacementModel();

        // Relative velocity at contact
        ChVector<> relvel = vel2 - vel1;
        double relvel_n_mag = relvel.Dot(normal_dir);
        ChVector<> relvel_n = relvel_n_mag * normal_dir;
        ChVector<> relvel_t = relvel - relvel_n;
        double relvel_t_mag = relvel_t.Length();

        // Calculate effective mass
        double eff_mass = this->objA->GetContactableMass() * this->objB->GetContactableMass() /
                          (this->objA->GetContactableMass() + this->objB->GetContactableMass());

        // Calculate stiffness and viscous damping coefficients.
        // All models use the following formulas for normal and tangential forces:
        //     Fn = kn * delta_n - gn * v_n
        //     Ft = kt * delta_t - gt * v_t
        double kn = 0;
        double kt = 0;
        double gn = 0;
        double gt = 0;

        double eps = std::numeric_limits<double>::epsilon();

        switch (contact_model) {
            case ChSystemSMC::Flores:
                // Currently not implemented.  Fall through to Hooke.
            case ChSystemSMC::Hooke:
                if (use_mat_props) {
                    double tmp_k = (16.0 / 15) * std::sqrt(this->eff_radius) * mat.E_eff;
                    double v2 = sys->GetCharacteristicImpactVelocity() * sys->GetCharacteristicImpactVelocity();
                    double loge = (mat.cr_eff < eps) ? std::log(eps) : std::log(mat.cr_eff);
                    loge = (mat.cr_eff > 1 - eps) ? std::log(1 - eps) : loge;
                    double tmp_g = 1 + std::pow(CH_C_PI / loge, 2);
                    kn = tmp_k * std::pow(eff_mass * v2 / tmp_k, 1.0 / 5);
                    kt = kn;
                    gn = std::sqrt(4 * eff_mass * kn / tmp_g);
                    gt = gn;
                } else {
                    kn = mat.kn;
                    kt = mat.kt;
                    gn = eff_mass * mat.gn;
                    gt = eff_mass * mat.gt;
                }

                break;

            case ChSystemSMC::Hertz:
                if (use_mat_props) {
                    double sqrt_Rd = std::sqrt(this->eff_radius * delta);
                    double Sn = 2 * mat.E_eff * sqrt_Rd;
                    double St = 8 * mat.G_eff * sqrt_Rd;
                    double loge = (mat.cr_eff < eps) ? std::log(eps) : std::log(mat.cr_eff);
                    double beta = loge / std::sqrt(loge * loge + CH_C_PI * CH_C_PI);
                    kn = (2.0 / 3) * Sn;
                    kt = St;
                    gn = -2 * std::sqrt(5.0 / 6) * beta * std::sqrt(Sn * eff_mass);
                    gt = -2 * std::sqrt(5.0 / 6) * beta * std::sqrt(St * eff_mass);
                } else {
                    double tmp = this->eff_radius * std::sqrt(delta);
                    kn = tmp * mat.kn;
                    kt = tmp * mat.kt;
                    gn = tmp * eff_mass * mat.gn;
                    gt = tmp * eff_mass * mat.gt;
                }

                break;

            case ChSystemSMC::PlainCoulomb:
                if (use_mat_props) {
                    double sqrt_Rd = std::sqrt(delta);
                    double Sn = 2 * mat.E_eff * sqrt_Rd;
                    double loge = (mat.cr_eff < eps) ? std::log(eps) : std::log(mat.cr_eff);
                    double beta = loge / std::sqrt(loge * loge + CH_C_PI * CH_C_PI);
                    kn = (2.0 / 3) * Sn;
                    gn = -2 * std::sqrt(5.0 / 6) * beta * std::sqrt(Sn * eff_mass);
                } else {
                    double tmp = std::sqrt(delta);
                    kn = tmp * mat.kn;
                    gn = tmp * mat.gn;
                }

                kt = 0;
                gt = 0;

                {
                    double forceN = kn * delta - gn * relvel_n_mag;
                    if (forceN < 0)
                        forceN = 0;
                    double forceT = mat.mu_eff * std::tanh(5.0 * relvel_t_mag) * forceN;
                    switch (adhesion_model) {
                        case ChSystemSMC::AdhesionForceModel::Perko:
                            // Currently not implemented.  Fall through to Constant.
                        case ChSystemSMC::AdhesionForceModel::Constant:
                            forceN -= mat.adhesion_eff;
                            break;
                        case ChSystemSMC::AdhesionForceModel::DMT:
                            forceN -= mat.adhesionMultDMT_eff * sqrt(this->eff_radius);
                            break;
                    }
                    ChVector<> force = forceN * normal_dir;
                    if (relvel_t_mag >= sys->GetSlipVelocityThreshold())
                        force -= (forceT / relvel_t_mag) * relvel_t;

                    return force;
                }
        }

        // Tangential displacement (magnitude)
        double delta_t = 0;
        switch (tdispl_model) {
            case ChSystemSMC::OneStep:
                delta_t = relvel_t_mag * dT;
                break;
            case ChSystemSMC::MultiStep:
                //// TODO: implement proper MultiStep mode
                delta_t = relvel_t_mag * dT;
                break;
            default:
                break;
        }

        // Calculate the magnitudes of the normal and tangential contact forces
        double forceN = kn * delta - gn * relvel_n_mag;
        double forceT = kt * delta_t + gt * relvel_t_mag;

        // If the resulting normal contact force is negative, the two shapes are moving
        // away from each other so fast that no contact force is generated.
        if (forceN < 0) {
            forceN = 0;
            forceT = 0;
        }

        // Include adhesion force
        switch (adhesion_model) {
            case ChSystemSMC::AdhesionForceModel::Perko:
                // Currently not implemented.  Fall through to Constant.
            case ChSystemSMC::AdhesionForceModel::Constant:
                forceN -= mat.adhesion_eff;
                break;
            case ChSystemSMC::AdhesionForceModel::DMT:
                forceN -= mat.adhesionMultDMT_eff * sqrt(this->eff_radius);
                break;
        }

        // Coulomb law
        forceT = std::min<double>(forceT, mat.mu_eff * std::abs(forceN));

        // Accumulate normal and tangential forces
        ChVector<> force = forceN * normal_dir;
        if (relvel_t_mag >= sys->GetSlipVelocityThreshold())
            force -= (forceT / relvel_t_mag) * relvel_t;

        return force;
        */
    }